

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WriteSignedBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  Type type;
  Type type_00;
  Type TVar1;
  size_t size;
  Newline *in_RCX;
  char (*u) [3];
  Opcode opcode_local;
  StackVar local_54;
  StackVar local_48;
  StackVar local_3c;
  
  opcode_local = opcode;
  type = Opcode::GetResultType(&opcode_local);
  type_00 = Opcode::GetParamType1(&opcode_local);
  TVar1 = Opcode::GetParamType2(&opcode_local);
  if (TVar1 == type_00) {
    local_48.index = 1;
    local_48.type.enum_ = Any;
    local_48.type.type_index_ = 0;
    local_54.index = 0;
    local_54.type.enum_ = Any;
    local_54.type.type_index_ = 0;
    local_3c.index = local_48.index;
    local_3c.type = type;
    Write(this,&local_3c);
    WriteData(this," = (",4);
    Write(this,type_00);
    WriteData(this,")((",3);
    Write(this,(SignedType)type_00);
    WriteData(this,")",1);
    Write(this,&local_48);
    WriteData(this," ",1);
    size = strlen(op);
    WriteData(this,op,size);
    WriteData(this," (",2);
    Write(this,(SignedType)type_00);
    WriteData(this,")",1);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,&local_54,u,in_RCX);
    DropTypes(this,2);
    PushType(this,type);
    return;
  }
  __assert_fail("opcode.GetParamType2() == type",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0x10d6,
                "void wabt::(anonymous namespace)::CWriter::WriteSignedBinaryExpr(Opcode, const char *)"
               );
}

Assistant:

void CWriter::WriteSignedBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Type type = opcode.GetParamType1();
  assert(opcode.GetParamType2() == type);
  Write(StackVar(1, result_type), " = (", type, ")((", SignedType(type), ")",
        StackVar(1), " ", op, " (", SignedType(type), ")", StackVar(0), ");",
        Newline());
  DropTypes(2);
  PushType(result_type);
}